

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O3

void ConvertARGBToY_SSE2(uint32_t *argb,uint8_t *y,int width)

{
  uint8_t *puVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  uint uVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  byte bVar49;
  undefined1 uVar50;
  undefined1 uVar51;
  undefined1 uVar52;
  undefined1 uVar53;
  undefined1 uVar54;
  undefined1 uVar55;
  byte bVar56;
  undefined1 uVar57;
  undefined1 uVar58;
  undefined1 uVar59;
  undefined1 uVar60;
  undefined1 uVar61;
  undefined1 uVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  ushort uVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  ushort uVar92;
  undefined1 auVar93 [15];
  unkuint9 Var94;
  undefined1 auVar95 [11];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  unkuint9 Var98;
  undefined1 auVar99 [11];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  unkuint9 Var102;
  undefined1 auVar103 [11];
  undefined1 auVar104 [15];
  unkuint9 Var105;
  undefined1 auVar106 [11];
  undefined3 uVar107;
  undefined3 uVar108;
  undefined8 uVar109;
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined8 uVar112;
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  undefined1 auVar117 [15];
  undefined1 auVar118 [15];
  uint uVar119;
  undefined5 uVar120;
  undefined5 uVar121;
  undefined1 auVar122 [12];
  undefined8 uVar123;
  undefined1 auVar124 [12];
  undefined8 uVar125;
  undefined1 auVar126 [14];
  undefined8 uVar127;
  undefined1 auVar128 [14];
  undefined8 uVar129;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  ulong uVar132;
  undefined2 uVar133;
  byte bVar142;
  undefined1 uVar143;
  undefined1 auVar134 [16];
  undefined1 auVar144 [16];
  undefined1 auVar152 [16];
  byte bVar164;
  undefined1 uVar165;
  undefined1 auVar157 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar166 [16];
  undefined2 uVar174;
  undefined1 auVar175 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar207 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  byte bVar153;
  undefined1 uVar154;
  byte bVar155;
  undefined1 uVar156;
  undefined1 auVar158 [16];
  undefined1 auVar161 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar197 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar200 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  byte bVar203;
  undefined1 uVar204;
  byte bVar205;
  undefined1 uVar206;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  
  auVar131 = _DAT_0014a920;
  auVar130 = _DAT_0014a910;
  if ((int)(width & 0xfffffff0U) < 1) {
    uVar132 = 0;
  }
  else {
    uVar132 = 0;
    do {
      auVar162 = *(undefined1 (*) [16])(argb + uVar132);
      puVar2 = argb + uVar132 + 4;
      bVar49 = *(byte *)((long)puVar2 + 1);
      uVar50 = *(undefined1 *)((long)puVar2 + 3);
      uVar51 = *(undefined1 *)((long)puVar2 + 5);
      uVar52 = *(undefined1 *)((long)puVar2 + 9);
      uVar53 = (undefined1)puVar2[3];
      uVar54 = *(undefined1 *)((long)puVar2 + 0xd);
      uVar55 = *(undefined1 *)((long)puVar2 + 0xe);
      auVar184 = *(undefined1 (*) [16])(argb + uVar132 + 8);
      puVar3 = argb + uVar132 + 0xc;
      bVar56 = *(byte *)((long)puVar3 + 1);
      uVar57 = *(undefined1 *)((long)puVar3 + 3);
      uVar58 = *(undefined1 *)((long)puVar3 + 5);
      uVar59 = *(undefined1 *)((long)puVar3 + 9);
      uVar60 = (undefined1)puVar3[3];
      uVar61 = *(undefined1 *)((long)puVar3 + 0xd);
      uVar62 = *(undefined1 *)((long)puVar3 + 0xe);
      auVar192._0_14_ = auVar162._0_14_;
      auVar192[0xe] = auVar162[7];
      auVar192[0xf] = *(undefined1 *)((long)puVar2 + 7);
      auVar191._14_2_ = auVar192._14_2_;
      auVar191._0_13_ = auVar162._0_13_;
      auVar191[0xd] = *(undefined1 *)((long)puVar2 + 6);
      uVar206 = auVar162[6];
      auVar190._13_3_ = auVar191._13_3_;
      auVar190._0_12_ = auVar162._0_12_;
      auVar190[0xc] = uVar206;
      auVar189._12_4_ = auVar190._12_4_;
      auVar189._0_11_ = auVar162._0_11_;
      auVar189[0xb] = uVar51;
      bVar205 = auVar162[5];
      auVar188._11_5_ = auVar189._11_5_;
      auVar188._0_10_ = auVar162._0_10_;
      auVar188[10] = bVar205;
      auVar187._10_6_ = auVar188._10_6_;
      auVar187._0_9_ = auVar162._0_9_;
      auVar187[9] = (char)puVar2[1];
      uVar204 = auVar162[4];
      auVar186._9_7_ = auVar187._9_7_;
      auVar186._0_8_ = auVar162._0_8_;
      auVar186[8] = uVar204;
      auVar65._1_8_ = auVar186._8_8_;
      auVar65[0] = uVar50;
      auVar65._9_7_ = 0;
      auVar64._10_6_ = 0;
      auVar64._0_10_ = SUB1610(auVar65 << 0x38,6);
      auVar63._11_5_ = 0;
      auVar63._0_11_ = SUB1611(auVar64 << 0x30,5);
      auVar201._12_4_ = 0;
      auVar201._0_12_ = SUB1612(auVar63 << 0x28,4);
      bVar203 = auVar162[1];
      auVar216._13_3_ = 0;
      auVar216._0_13_ = SUB1613(auVar201 << 0x20,3);
      auVar194._14_2_ = 0;
      auVar194._0_14_ = SUB1614(auVar216 << 0x18,2);
      auVar194 = auVar194 << 0x10;
      bVar142 = auVar162[9];
      uVar143 = auVar162[0xd];
      auVar151._0_14_ = auVar184._0_14_;
      auVar151[0xe] = auVar184[7];
      auVar151[0xf] = *(undefined1 *)((long)puVar3 + 7);
      auVar150._14_2_ = auVar151._14_2_;
      auVar150._0_13_ = auVar184._0_13_;
      auVar150[0xd] = *(undefined1 *)((long)puVar3 + 6);
      uVar156 = auVar184[6];
      auVar149._13_3_ = auVar150._13_3_;
      auVar149._0_12_ = auVar184._0_12_;
      auVar149[0xc] = uVar156;
      auVar148._12_4_ = auVar149._12_4_;
      auVar148._0_11_ = auVar184._0_11_;
      auVar148[0xb] = uVar58;
      bVar155 = auVar184[5];
      auVar147._11_5_ = auVar148._11_5_;
      auVar147._0_10_ = auVar184._0_10_;
      auVar147[10] = bVar155;
      auVar146._10_6_ = auVar147._10_6_;
      auVar146._0_9_ = auVar184._0_9_;
      auVar146[9] = (char)puVar3[1];
      uVar154 = auVar184[4];
      auVar145._9_7_ = auVar146._9_7_;
      auVar145._0_8_ = auVar184._0_8_;
      auVar145[8] = uVar154;
      auVar70._1_8_ = auVar145._8_8_;
      auVar70[0] = uVar57;
      auVar70._9_7_ = 0;
      auVar69._10_6_ = 0;
      auVar69._0_10_ = SUB1610(auVar70 << 0x38,6);
      auVar68._11_5_ = 0;
      auVar68._0_11_ = SUB1611(auVar69 << 0x30,5);
      auVar67._12_4_ = 0;
      auVar67._0_12_ = SUB1612(auVar68 << 0x28,4);
      bVar153 = auVar184[1];
      auVar66._13_3_ = 0;
      auVar66._0_13_ = SUB1613(auVar67 << 0x20,3);
      auVar144._14_2_ = 0;
      auVar144._0_14_ = SUB1614(auVar66 << 0x18,2);
      auVar144 = auVar144 << 0x10;
      bVar164 = auVar184[9];
      uVar165 = auVar184[0xd];
      auVar182._0_14_ = auVar194._0_14_;
      auVar182[0xe] = uVar50;
      auVar182[0xf] = *(undefined1 *)((long)puVar2 + 0xb);
      auVar181._14_2_ = auVar182._14_2_;
      auVar181._0_13_ = auVar194._0_13_;
      auVar181[0xd] = auVar162[0xb];
      auVar180._13_3_ = auVar181._13_3_;
      auVar180._0_12_ = auVar194._0_12_;
      auVar180[0xc] = auVar162[3];
      auVar179._12_4_ = auVar180._12_4_;
      auVar179._0_11_ = auVar194._0_11_;
      auVar179[0xb] = *(undefined1 *)((long)puVar2 + 10);
      auVar178._11_5_ = auVar179._11_5_;
      auVar178._0_10_ = auVar194._0_10_;
      auVar178[10] = *(undefined1 *)((long)puVar2 + 2);
      auVar177._10_6_ = auVar178._10_6_;
      auVar177._0_9_ = auVar194._0_9_;
      auVar177[9] = auVar162[10];
      auVar176._9_7_ = auVar177._9_7_;
      auVar176._0_8_ = auVar194._0_8_;
      auVar176[8] = auVar162[2];
      auVar75._1_8_ = auVar176._8_8_;
      auVar75[0] = uVar52;
      auVar75._9_7_ = 0;
      auVar74._10_6_ = 0;
      auVar74._0_10_ = SUB1610(auVar75 << 0x38,6);
      auVar73._11_5_ = 0;
      auVar73._0_11_ = SUB1611(auVar74 << 0x30,5);
      auVar72._12_4_ = 0;
      auVar72._0_12_ = SUB1612(auVar73 << 0x28,4);
      auVar71._13_3_ = 0;
      auVar71._0_13_ = SUB1613(auVar72 << 0x20,3);
      auVar175._14_2_ = 0;
      auVar175._0_14_ = SUB1614(auVar71 << 0x18,2);
      auVar175 = auVar175 << 0x10;
      auVar141._0_14_ = auVar144._0_14_;
      auVar141[0xe] = uVar57;
      auVar141[0xf] = *(undefined1 *)((long)puVar3 + 0xb);
      auVar140._14_2_ = auVar141._14_2_;
      auVar140._0_13_ = auVar144._0_13_;
      auVar140[0xd] = auVar184[0xb];
      auVar139._13_3_ = auVar140._13_3_;
      auVar139._0_12_ = auVar144._0_12_;
      auVar139[0xc] = auVar184[3];
      auVar138._12_4_ = auVar139._12_4_;
      auVar138._0_11_ = auVar144._0_11_;
      auVar138[0xb] = *(undefined1 *)((long)puVar3 + 10);
      auVar137._11_5_ = auVar138._11_5_;
      auVar137._0_10_ = auVar144._0_10_;
      auVar137[10] = *(undefined1 *)((long)puVar3 + 2);
      auVar136._10_6_ = auVar137._10_6_;
      auVar136._0_9_ = auVar144._0_9_;
      auVar136[9] = auVar184[10];
      auVar135._9_7_ = auVar136._9_7_;
      auVar135._0_8_ = auVar144._0_8_;
      auVar135[8] = auVar184[2];
      auVar80._1_8_ = auVar135._8_8_;
      auVar80[0] = uVar59;
      auVar80._9_7_ = 0;
      auVar79._10_6_ = 0;
      auVar79._0_10_ = SUB1610(auVar80 << 0x38,6);
      auVar78._11_5_ = 0;
      auVar78._0_11_ = SUB1611(auVar79 << 0x30,5);
      auVar77._12_4_ = 0;
      auVar77._0_12_ = SUB1612(auVar78 << 0x28,4);
      auVar76._13_3_ = 0;
      auVar76._0_13_ = SUB1613(auVar77 << 0x20,3);
      auVar134._14_2_ = 0;
      auVar134._0_14_ = SUB1614(auVar76 << 0x18,2);
      auVar134 = auVar134 << 0x10;
      auVar214._0_14_ = auVar175._0_14_;
      auVar214[0xe] = uVar52;
      auVar214[0xf] = uVar54;
      auVar213._14_2_ = auVar214._14_2_;
      auVar213._0_13_ = auVar175._0_13_;
      auVar213[0xd] = uVar51;
      auVar212._13_3_ = auVar213._13_3_;
      auVar212._0_12_ = auVar175._0_12_;
      auVar212[0xc] = bVar49;
      auVar211._12_4_ = auVar212._12_4_;
      auVar211._0_11_ = auVar175._0_11_;
      auVar211[0xb] = uVar143;
      auVar210._11_5_ = auVar211._11_5_;
      auVar210._0_10_ = auVar175._0_10_;
      auVar210[10] = bVar142;
      auVar209._10_6_ = auVar210._10_6_;
      auVar209._0_9_ = auVar175._0_9_;
      auVar209[9] = bVar205;
      auVar208._9_7_ = auVar209._9_7_;
      auVar208._0_8_ = auVar175._0_8_;
      auVar208[8] = bVar203;
      auVar85._1_8_ = auVar208._8_8_;
      auVar85[0] = uVar53;
      auVar85._9_7_ = 0;
      auVar84._10_6_ = 0;
      auVar84._0_10_ = SUB1610(auVar85 << 0x38,6);
      auVar83._11_5_ = 0;
      auVar83._0_11_ = SUB1611(auVar84 << 0x30,5);
      auVar82._12_4_ = 0;
      auVar82._0_12_ = SUB1612(auVar83 << 0x28,4);
      auVar81._13_3_ = 0;
      auVar81._0_13_ = SUB1613(auVar82 << 0x20,3);
      auVar207._2_14_ = SUB1614(auVar81 << 0x18,2);
      auVar207._0_2_ = CONCAT11(uVar204,auVar162[0]);
      uVar174 = CONCAT11(uVar206,auVar162[2]);
      uVar86 = CONCAT11(auVar162[3],uVar55);
      uVar107 = CONCAT12(auVar162[7],uVar86);
      uVar4 = CONCAT13(auVar162[0xb],uVar107);
      uVar120 = CONCAT14(auVar162[0xf],uVar4);
      auVar126[5] = uVar50;
      auVar126._0_5_ = uVar120;
      auVar173._0_14_ = auVar134._0_14_;
      auVar173[0xe] = uVar59;
      auVar173[0xf] = uVar61;
      auVar172._14_2_ = auVar173._14_2_;
      auVar172._0_13_ = auVar134._0_13_;
      auVar172[0xd] = uVar58;
      auVar171._13_3_ = auVar172._13_3_;
      auVar171._0_12_ = auVar134._0_12_;
      auVar171[0xc] = bVar56;
      auVar170._12_4_ = auVar171._12_4_;
      auVar170._0_11_ = auVar134._0_11_;
      auVar170[0xb] = uVar165;
      auVar169._11_5_ = auVar170._11_5_;
      auVar169._0_10_ = auVar134._0_10_;
      auVar169[10] = bVar164;
      auVar168._10_6_ = auVar169._10_6_;
      auVar168._0_9_ = auVar134._0_9_;
      auVar168[9] = bVar155;
      auVar167._9_7_ = auVar168._9_7_;
      auVar167._0_8_ = auVar134._0_8_;
      auVar167[8] = bVar153;
      auVar91._1_8_ = auVar167._8_8_;
      auVar91[0] = uVar60;
      auVar91._9_7_ = 0;
      auVar90._10_6_ = 0;
      auVar90._0_10_ = SUB1610(auVar91 << 0x38,6);
      auVar89._11_5_ = 0;
      auVar89._0_11_ = SUB1611(auVar90 << 0x30,5);
      auVar88._12_4_ = 0;
      auVar88._0_12_ = SUB1612(auVar89 << 0x28,4);
      auVar87._13_3_ = 0;
      auVar87._0_13_ = SUB1613(auVar88 << 0x20,3);
      auVar166._2_14_ = SUB1614(auVar87 << 0x18,2);
      auVar166._0_2_ = CONCAT11(uVar154,auVar184[0]);
      uVar133 = CONCAT11(uVar156,auVar184[2]);
      uVar92 = CONCAT11(auVar184[3],uVar62);
      uVar108 = CONCAT12(auVar184[7],uVar92);
      uVar119 = CONCAT13(auVar184[0xb],uVar108);
      uVar121 = CONCAT14(auVar184[0xf],uVar119);
      auVar128[5] = uVar57;
      auVar128._0_5_ = uVar121;
      auVar126._6_8_ = 0;
      auVar21[0xe] = uVar55;
      auVar21._0_14_ = auVar126 << 0x38;
      uVar127 = CONCAT26(auVar21._13_2_,CONCAT15(*(undefined1 *)((long)puVar2 + 10),uVar120));
      auVar122._4_8_ = 0;
      auVar122._0_4_ = uVar4;
      auVar27._12_3_ = (int3)((ulong)uVar127 >> 0x28);
      auVar27._0_12_ = auVar122 << 0x38;
      uVar123 = CONCAT44(auVar27._11_4_,CONCAT13(*(undefined1 *)((long)puVar2 + 6),uVar107));
      auVar35._10_5_ = (int5)((ulong)uVar123 >> 0x18);
      auVar35._0_10_ = (unkuint10)uVar86 << 0x38;
      uVar109 = CONCAT62(auVar35._9_6_,CONCAT11(*(undefined1 *)((long)puVar2 + 2),uVar55));
      auVar93._7_8_ = 0;
      auVar93._0_7_ = (uint7)((ulong)uVar109 >> 8);
      Var94 = CONCAT81(SUB158(auVar93 << 0x40,7),auVar162[0xe]);
      auVar110._9_6_ = 0;
      auVar110._0_9_ = Var94;
      auVar95._1_10_ = SUB1510(auVar110 << 0x30,5);
      auVar95[0] = auVar162[10];
      auVar111._11_4_ = 0;
      auVar111._0_11_ = auVar95;
      auVar45[2] = uVar206;
      auVar45._0_2_ = uVar174;
      auVar45._3_12_ = SUB1512(auVar111 << 0x20,3);
      auVar96._13_2_ = 0;
      auVar96._0_13_ = auVar45._2_13_;
      auVar128._6_8_ = 0;
      auVar22[0xe] = uVar62;
      auVar22._0_14_ = auVar128 << 0x38;
      uVar129 = CONCAT26(auVar22._13_2_,CONCAT15(*(undefined1 *)((long)puVar3 + 10),uVar121));
      auVar124._4_8_ = 0;
      auVar124._0_4_ = uVar119;
      auVar28._12_3_ = (int3)((ulong)uVar129 >> 0x28);
      auVar28._0_12_ = auVar124 << 0x38;
      uVar125 = CONCAT44(auVar28._11_4_,CONCAT13(*(undefined1 *)((long)puVar3 + 6),uVar108));
      auVar36._10_5_ = (int5)((ulong)uVar125 >> 0x18);
      auVar36._0_10_ = (unkuint10)uVar92 << 0x38;
      uVar112 = CONCAT62(auVar36._9_6_,CONCAT11(*(undefined1 *)((long)puVar3 + 2),uVar62));
      auVar97._7_8_ = 0;
      auVar97._0_7_ = (uint7)((ulong)uVar112 >> 8);
      Var98 = CONCAT81(SUB158(auVar97 << 0x40,7),auVar184[0xe]);
      auVar113._9_6_ = 0;
      auVar113._0_9_ = Var98;
      auVar99._1_10_ = SUB1510(auVar113 << 0x30,5);
      auVar99[0] = auVar184[10];
      auVar114._11_4_ = 0;
      auVar114._0_11_ = auVar99;
      auVar46[2] = uVar156;
      auVar46._0_2_ = uVar133;
      auVar46._3_12_ = SUB1512(auVar114 << 0x20,3);
      auVar100._13_2_ = 0;
      auVar100._0_13_ = auVar46._2_13_;
      auVar161[10] = uVar51;
      auVar161._0_10_ = (unkuint10)bVar49 << 0x40;
      auVar161[0xb] = 0;
      auVar200[10] = uVar58;
      auVar200._0_10_ = (unkuint10)bVar56 << 0x40;
      auVar200[0xb] = 0;
      auVar23[0xd] = 0;
      auVar23._0_13_ = auVar207._0_13_;
      auVar23[0xe] = uVar53;
      auVar25[0xc] = (char)puVar2[2];
      auVar25._0_12_ = auVar207._0_12_;
      auVar25._13_2_ = auVar23._13_2_;
      auVar29[0xb] = 0;
      auVar29._0_11_ = auVar207._0_11_;
      auVar29._12_3_ = auVar25._12_3_;
      auVar31[10] = (char)puVar2[1];
      auVar31._0_10_ = auVar207._0_10_;
      auVar31._11_4_ = auVar29._11_4_;
      auVar37[9] = 0;
      auVar37._0_9_ = auVar207._0_9_;
      auVar37._10_5_ = auVar31._10_5_;
      auVar41[8] = (char)*puVar2;
      auVar41._0_8_ = auVar207._0_8_;
      auVar41._9_6_ = auVar37._9_6_;
      auVar101._7_8_ = 0;
      auVar101._0_7_ = auVar41._8_7_;
      Var102 = CONCAT81(SUB158(auVar101 << 0x40,7),auVar162[0xc]);
      auVar115._9_6_ = 0;
      auVar115._0_9_ = Var102;
      auVar103._1_10_ = SUB1510(auVar115 << 0x30,5);
      auVar103[0] = auVar162[8];
      auVar116._11_4_ = 0;
      auVar116._0_11_ = auVar103;
      auVar47[2] = uVar204;
      auVar47._0_2_ = auVar207._0_2_;
      auVar47._3_12_ = SUB1512(auVar116 << 0x20,3);
      auVar24[0xd] = 0;
      auVar24._0_13_ = auVar166._0_13_;
      auVar24[0xe] = uVar60;
      auVar26[0xc] = (char)puVar3[2];
      auVar26._0_12_ = auVar166._0_12_;
      auVar26._13_2_ = auVar24._13_2_;
      auVar30[0xb] = 0;
      auVar30._0_11_ = auVar166._0_11_;
      auVar30._12_3_ = auVar26._12_3_;
      auVar32[10] = (char)puVar3[1];
      auVar32._0_10_ = auVar166._0_10_;
      auVar32._11_4_ = auVar30._11_4_;
      auVar38[9] = 0;
      auVar38._0_9_ = auVar166._0_9_;
      auVar38._10_5_ = auVar32._10_5_;
      auVar42[8] = (char)*puVar3;
      auVar42._0_8_ = auVar166._0_8_;
      auVar42._9_6_ = auVar38._9_6_;
      auVar104._7_8_ = 0;
      auVar104._0_7_ = auVar42._8_7_;
      Var105 = CONCAT81(SUB158(auVar104 << 0x40,7),auVar184[0xc]);
      auVar117._9_6_ = 0;
      auVar117._0_9_ = Var105;
      auVar106._1_10_ = SUB1510(auVar117 << 0x30,5);
      auVar106[0] = auVar184[8];
      auVar118._11_4_ = 0;
      auVar118._0_11_ = auVar106;
      auVar48[2] = uVar154;
      auVar48._0_2_ = auVar166._0_2_;
      auVar48._3_12_ = SUB1512(auVar118 << 0x20,3);
      auVar33._12_2_ = (short)Var94;
      auVar33._0_12_ = SUB1512(auVar96 << 0x10,0);
      auVar33[0xe] = uVar143;
      auVar39[10] = bVar142;
      auVar39._0_10_ = SUB1510(auVar96 << 0x10,0);
      auVar39[0xb] = 0;
      auVar39._12_3_ = auVar33._12_3_;
      auVar43._10_5_ = auVar39._10_5_;
      auVar43._8_2_ = auVar95._0_2_;
      auVar43._0_8_ = (ulong)bVar205 << 0x30;
      auVar215._6_9_ = auVar43._6_9_;
      auVar215._4_2_ = auVar45._2_2_;
      auVar215._0_4_ = CONCAT12(bVar203,uVar174) & 0xffff00ff;
      auVar215[0xf] = 0;
      auVar193[1] = 0;
      auVar193[0] = bVar49;
      auVar183[2] = bVar49;
      auVar183._0_2_ = (short)((ulong)uVar109 >> 8);
      auVar183[3] = 0;
      auVar183._4_2_ = (short)((ulong)uVar123 >> 0x18);
      auVar183[6] = uVar51;
      auVar183[7] = 0;
      auVar183._8_2_ = (short)((ulong)uVar127 >> 0x28);
      auVar183[10] = uVar52;
      auVar183[0xb] = 0;
      auVar183[0xc] = uVar55;
      auVar183[0xd] = 0;
      auVar183[0xe] = uVar54;
      auVar183[0xf] = 0;
      auVar161[0xc] = uVar143;
      auVar161[0xd] = 0;
      auVar161._14_2_ = (short)Var102;
      auVar160._12_4_ = auVar161._12_4_;
      auVar160._10_2_ = auVar103._0_2_;
      auVar160._0_10_ = (unkuint10)bVar49 << 0x40;
      auVar159._10_6_ = auVar160._10_6_;
      auVar159._0_10_ = (unkuint10)bVar142 << 0x40;
      auVar158._8_8_ = auVar159._8_8_;
      auVar158._6_2_ = auVar47._2_2_;
      auVar158._0_6_ = (uint6)bVar205 << 0x20;
      auVar157._4_12_ = auVar158._4_12_;
      uVar4 = CONCAT22(auVar207._0_2_,(ushort)bVar203);
      auVar157._0_4_ = uVar4 & 0xffffff;
      auVar193._2_2_ = auVar41._8_2_;
      auVar193[4] = uVar51;
      auVar193[5] = 0;
      auVar193._6_2_ = auVar31._10_2_;
      auVar193[8] = uVar52;
      auVar193[9] = 0;
      auVar193._10_2_ = auVar25._12_2_;
      auVar193[0xc] = uVar54;
      auVar193[0xd] = 0;
      auVar193[0xe] = uVar53;
      auVar193[0xf] = 0;
      auVar216 = pmaddwd(auVar215,auVar130);
      auVar184 = pmaddwd(auVar183,auVar130);
      auVar162 = pmaddwd(auVar157,auVar131);
      auVar194 = pmaddwd(auVar193,auVar131);
      auVar163._0_4_ = auVar162._0_4_ + auVar216._0_4_ + 0x108000U >> 0x10;
      auVar163._4_4_ = auVar162._4_4_ + auVar216._4_4_ + 0x108000U >> 0x10;
      auVar163._8_4_ = auVar162._8_4_ + auVar216._8_4_ + 0x108000U >> 0x10;
      auVar163._12_4_ = auVar162._12_4_ + auVar216._12_4_ + 0x108000U >> 0x10;
      auVar195._0_4_ = auVar194._0_4_ + auVar184._0_4_ + 0x108000U >> 0x10;
      auVar195._4_4_ = auVar194._4_4_ + auVar184._4_4_ + 0x108000U >> 0x10;
      auVar195._8_4_ = auVar194._8_4_ + auVar184._8_4_ + 0x108000U >> 0x10;
      auVar195._12_4_ = auVar194._12_4_ + auVar184._12_4_ + 0x108000U >> 0x10;
      auVar194 = packssdw(auVar163,auVar195);
      auVar34._12_2_ = (short)Var98;
      auVar34._0_12_ = SUB1512(auVar100 << 0x10,0);
      auVar34[0xe] = uVar165;
      auVar40[10] = bVar164;
      auVar40._0_10_ = SUB1510(auVar100 << 0x10,0);
      auVar40[0xb] = 0;
      auVar40._12_3_ = auVar34._12_3_;
      auVar44._10_5_ = auVar40._10_5_;
      auVar44._8_2_ = auVar99._0_2_;
      auVar44._0_8_ = (ulong)bVar155 << 0x30;
      auVar185._6_9_ = auVar44._6_9_;
      auVar185._4_2_ = auVar46._2_2_;
      auVar185._0_4_ = CONCAT12(bVar153,uVar133) & 0xffff00ff;
      auVar185[0xf] = 0;
      auVar184[1] = 0;
      auVar184[0] = bVar56;
      auVar162[2] = bVar56;
      auVar162._0_2_ = (short)((ulong)uVar112 >> 8);
      auVar162[3] = 0;
      auVar162._4_2_ = (short)((ulong)uVar125 >> 0x18);
      auVar162[6] = uVar58;
      auVar162[7] = 0;
      auVar162._8_2_ = (short)((ulong)uVar129 >> 0x28);
      auVar162[10] = uVar59;
      auVar162[0xb] = 0;
      auVar162[0xc] = uVar62;
      auVar162[0xd] = 0;
      auVar162[0xe] = uVar61;
      auVar162[0xf] = 0;
      auVar200[0xc] = uVar165;
      auVar200[0xd] = 0;
      auVar200._14_2_ = (short)Var105;
      auVar199._12_4_ = auVar200._12_4_;
      auVar199._10_2_ = auVar106._0_2_;
      auVar199._0_10_ = (unkuint10)bVar56 << 0x40;
      auVar198._10_6_ = auVar199._10_6_;
      auVar198._0_10_ = (unkuint10)bVar164 << 0x40;
      auVar197._8_8_ = auVar198._8_8_;
      auVar197._6_2_ = auVar48._2_2_;
      auVar197._0_6_ = (uint6)bVar155 << 0x20;
      auVar196._4_12_ = auVar197._4_12_;
      uVar4 = CONCAT22(auVar166._0_2_,(ushort)bVar153);
      auVar196._0_4_ = uVar4 & 0xffffff;
      auVar184._2_2_ = auVar42._8_2_;
      auVar184[4] = uVar58;
      auVar184[5] = 0;
      auVar184._6_2_ = auVar32._10_2_;
      auVar184[8] = uVar59;
      auVar184[9] = 0;
      auVar184._10_2_ = auVar26._12_2_;
      auVar184[0xc] = uVar61;
      auVar184[0xd] = 0;
      auVar184[0xe] = uVar60;
      auVar184[0xf] = 0;
      auVar216 = pmaddwd(auVar185,auVar130);
      auVar162 = pmaddwd(auVar162,auVar130);
      auVar201 = pmaddwd(auVar196,auVar131);
      auVar184 = pmaddwd(auVar184,auVar131);
      auVar202._0_4_ = auVar201._0_4_ + auVar216._0_4_ + 0x108000 >> 0x10;
      auVar202._4_4_ = auVar201._4_4_ + auVar216._4_4_ + 0x108000 >> 0x10;
      auVar202._8_4_ = auVar201._8_4_ + auVar216._8_4_ + 0x108000 >> 0x10;
      auVar202._12_4_ = auVar201._12_4_ + auVar216._12_4_ + 0x108000 >> 0x10;
      auVar152._0_4_ = auVar184._0_4_ + auVar162._0_4_ + 0x108000 >> 0x10;
      auVar152._4_4_ = auVar184._4_4_ + auVar162._4_4_ + 0x108000 >> 0x10;
      auVar152._8_4_ = auVar184._8_4_ + auVar162._8_4_ + 0x108000 >> 0x10;
      auVar152._12_4_ = auVar184._12_4_ + auVar162._12_4_ + 0x108000 >> 0x10;
      auVar162 = packssdw(auVar202,auVar152);
      sVar5 = auVar194._0_2_;
      sVar6 = auVar194._2_2_;
      sVar7 = auVar194._4_2_;
      sVar8 = auVar194._6_2_;
      sVar9 = auVar194._8_2_;
      sVar10 = auVar194._10_2_;
      sVar11 = auVar194._12_2_;
      sVar12 = auVar194._14_2_;
      sVar13 = auVar162._0_2_;
      sVar14 = auVar162._2_2_;
      sVar15 = auVar162._4_2_;
      sVar16 = auVar162._6_2_;
      sVar17 = auVar162._8_2_;
      sVar18 = auVar162._10_2_;
      sVar19 = auVar162._12_2_;
      sVar20 = auVar162._14_2_;
      puVar1 = y + uVar132;
      *puVar1 = (0 < sVar5) * (sVar5 < 0x100) * auVar194[0] - (0xff < sVar5);
      puVar1[1] = (0 < sVar6) * (sVar6 < 0x100) * auVar194[2] - (0xff < sVar6);
      puVar1[2] = (0 < sVar7) * (sVar7 < 0x100) * auVar194[4] - (0xff < sVar7);
      puVar1[3] = (0 < sVar8) * (sVar8 < 0x100) * auVar194[6] - (0xff < sVar8);
      puVar1[4] = (0 < sVar9) * (sVar9 < 0x100) * auVar194[8] - (0xff < sVar9);
      puVar1[5] = (0 < sVar10) * (sVar10 < 0x100) * auVar194[10] - (0xff < sVar10);
      puVar1[6] = (0 < sVar11) * (sVar11 < 0x100) * auVar194[0xc] - (0xff < sVar11);
      puVar1[7] = (0 < sVar12) * (sVar12 < 0x100) * auVar194[0xe] - (0xff < sVar12);
      puVar1[8] = (0 < sVar13) * (sVar13 < 0x100) * auVar162[0] - (0xff < sVar13);
      puVar1[9] = (0 < sVar14) * (sVar14 < 0x100) * auVar162[2] - (0xff < sVar14);
      puVar1[10] = (0 < sVar15) * (sVar15 < 0x100) * auVar162[4] - (0xff < sVar15);
      puVar1[0xb] = (0 < sVar16) * (sVar16 < 0x100) * auVar162[6] - (0xff < sVar16);
      puVar1[0xc] = (0 < sVar17) * (sVar17 < 0x100) * auVar162[8] - (0xff < sVar17);
      puVar1[0xd] = (0 < sVar18) * (sVar18 < 0x100) * auVar162[10] - (0xff < sVar18);
      puVar1[0xe] = (0 < sVar19) * (sVar19 < 0x100) * auVar162[0xc] - (0xff < sVar19);
      puVar1[0xf] = (0 < sVar20) * (sVar20 < 0x100) * auVar162[0xe] - (0xff < sVar20);
      uVar132 = uVar132 + 0x10;
    } while (uVar132 < (width & 0xfffffff0U));
  }
  if ((int)uVar132 < width) {
    uVar132 = uVar132 & 0xffffffff;
    do {
      uVar4 = argb[uVar132];
      y[uVar132] = (uint8_t)((uVar4 & 0xff) * 0x1914 + (uVar4 >> 0x10 & 0xff) * 0x41c7 +
                             (uVar4 >> 8 & 0xff) * 0x8123 + 0x108000 >> 0x10);
      uVar132 = uVar132 + 1;
    } while ((uint)width != uVar132);
  }
  return;
}

Assistant:

static void ConvertARGBToY_SSE2(const uint32_t* argb, uint8_t* y, int width) {
  const int max_width = width & ~15;
  int i;
  for (i = 0; i < max_width; i += 16) {
    __m128i Y0, Y1, rgb[6];
    RGB32PackedToPlanar_SSE2(&argb[i], rgb);
    ConvertRGBToY_SSE2(&rgb[0], &rgb[2], &rgb[4], &Y0);
    ConvertRGBToY_SSE2(&rgb[1], &rgb[3], &rgb[5], &Y1);
    STORE_16(_mm_packus_epi16(Y0, Y1), y + i);
  }
  for (; i < width; ++i) {   // left-over
    const uint32_t p = argb[i];
    y[i] = VP8RGBToY((p >> 16) & 0xff, (p >> 8) & 0xff, (p >>  0) & 0xff,
                     YUV_HALF);
  }
}